

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLLoader.cpp
# Opt level: O0

void __thiscall
Assimp::STLImporter::InternReadFile
          (STLImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  bool bVar1;
  uint uVar2;
  IOStream *__p;
  pointer pIVar3;
  DeadlyImportError *pDVar4;
  reference pvVar5;
  aiNode *this_00;
  aiMaterial *this_01;
  aiMaterial **ppaVar6;
  undefined1 local_548 [16];
  undefined1 auStack_538 [8];
  aiColor4D clrDiffuse;
  aiString s;
  aiMaterial *pcMat;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  byte local_c9;
  undefined1 local_c8 [7];
  bool bMatClr;
  vector<char,_std::allocator<char>_> buffer2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  string local_50;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_30;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  STLImporter *this_local;
  
  file._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"rb",&local_51);
  __p = IOSystem::Open(pIOHandler,pFile,&local_50);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_30,__p);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  if (pIVar3 == (pointer)0x0) {
    buffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 1;
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a8,"Failed to open STL file ",pFile);
    std::operator+(&local_88,&local_a8,".");
    DeadlyImportError::DeadlyImportError(pDVar4,&local_88);
    buffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 0;
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                     (&local_30);
  uVar2 = (*pIVar3->_vptr_IOStream[6])();
  this->fileSize = uVar2;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_c8);
  pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  BaseImporter::TextFileToBuffer
            (pIVar3,(vector<char,_std::allocator<char>_> *)local_c8,FORBID_EMPTY);
  this->pScene = pScene;
  pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_c8,0);
  this->mBuffer = pvVar5;
  (this->clrColorDefault).a = 0.6;
  (this->clrColorDefault).b = 0.6;
  (this->clrColorDefault).g = 0.6;
  (this->clrColorDefault).r = 0.6;
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  pScene->mRootNode = this_00;
  local_c9 = 0;
  bVar1 = anon_unknown.dwarf_ecfb9a::IsBinarySTL(this->mBuffer,this->fileSize);
  if (bVar1) {
    local_c9 = LoadBinaryFile(this);
  }
  else {
    bVar1 = anon_unknown.dwarf_ecfb9a::IsAsciiSTL(this->mBuffer,this->fileSize);
    if (!bVar1) {
      pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::operator+(&local_110,"Failed to determine STL storage representation for ",pFile);
      std::operator+(&local_f0,&local_110,".");
      DeadlyImportError::DeadlyImportError(pDVar4,&local_f0);
      __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    LoadASCIIFile(this,pScene->mRootNode);
  }
  this_01 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_01);
  aiString::aiString((aiString *)&clrDiffuse.a);
  aiString::Set((aiString *)&clrDiffuse.a,"DefaultMaterial");
  aiMaterial::AddProperty(this_01,(aiString *)&clrDiffuse.a,"?mat.name",0,0);
  aiColor4t<float>::aiColor4t((aiColor4t<float> *)auStack_538,1.0,1.0,1.0,1.0);
  if ((local_c9 & 1) != 0) {
    auStack_538._0_4_ = (this->clrColorDefault).r;
    auStack_538._4_4_ = (this->clrColorDefault).g;
    clrDiffuse.r = (this->clrColorDefault).b;
    clrDiffuse.g = (this->clrColorDefault).a;
  }
  aiMaterial::AddProperty(this_01,(aiColor4D *)auStack_538,1,"$clr.diffuse",0,0);
  aiMaterial::AddProperty(this_01,(aiColor4D *)auStack_538,1,"$clr.specular",0,0);
  aiColor4t<float>::aiColor4t((aiColor4t<float> *)local_548,0.05,0.05,0.05,1.0);
  auStack_538 = (undefined1  [8])local_548._0_8_;
  clrDiffuse.r = (float)local_548._8_4_;
  clrDiffuse.g = (float)local_548._12_4_;
  aiMaterial::AddProperty(this_01,(aiColor4D *)auStack_538,1,"$clr.ambient",0,0);
  pScene->mNumMaterials = 1;
  ppaVar6 = (aiMaterial **)operator_new__(8);
  pScene->mMaterials = ppaVar6;
  *pScene->mMaterials = this_01;
  this->mBuffer = (char *)0x0;
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_c8)
  ;
  std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr(&local_30);
  return;
}

Assistant:

void STLImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler )
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == nullptr) {
        throw DeadlyImportError( "Failed to open STL file " + pFile + ".");
    }

    fileSize = (unsigned int)file->FileSize();

    // allocate storage and copy the contents of the file to a memory buffer
    // (terminate it with zero)
    std::vector<char> buffer2;
    TextFileToBuffer(file.get(),buffer2);

    this->pScene = pScene;
    this->mBuffer = &buffer2[0];

    // the default vertex color is light gray.
    clrColorDefault.r = clrColorDefault.g = clrColorDefault.b = clrColorDefault.a = (ai_real) 0.6;

    // allocate a single node
    pScene->mRootNode = new aiNode();

    bool bMatClr = false;

    if (IsBinarySTL(mBuffer, fileSize)) {
        bMatClr = LoadBinaryFile();
    } else if (IsAsciiSTL(mBuffer, fileSize)) {
        LoadASCIIFile( pScene->mRootNode );
    } else {
        throw DeadlyImportError( "Failed to determine STL storage representation for " + pFile + ".");
    }

    // create a single default material, using a white diffuse color for consistency with
    // other geometric types (e.g., PLY).
    aiMaterial* pcMat = new aiMaterial();
    aiString s;
    s.Set(AI_DEFAULT_MATERIAL_NAME);
    pcMat->AddProperty(&s, AI_MATKEY_NAME);

    aiColor4D clrDiffuse(ai_real(1.0),ai_real(1.0),ai_real(1.0),ai_real(1.0));
    if (bMatClr) {
        clrDiffuse = clrColorDefault;
    }
    pcMat->AddProperty(&clrDiffuse,1,AI_MATKEY_COLOR_DIFFUSE);
    pcMat->AddProperty(&clrDiffuse,1,AI_MATKEY_COLOR_SPECULAR);
    clrDiffuse = aiColor4D( ai_real(0.05), ai_real(0.05), ai_real(0.05), ai_real(1.0));
    pcMat->AddProperty(&clrDiffuse,1,AI_MATKEY_COLOR_AMBIENT);

    pScene->mNumMaterials = 1;
    pScene->mMaterials = new aiMaterial*[1];
    pScene->mMaterials[0] = pcMat;

    mBuffer = nullptr;
}